

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Card.cpp
# Opt level: O0

bool __thiscall Card::isBigger(Card *this,Card *rhs,Contract *c)

{
  Type TVar1;
  Type TVar2;
  Type TVar3;
  Type TVar4;
  undefined1 local_3d;
  Contract *c_local;
  Card *rhs_local;
  Card *this_local;
  
  TVar1 = getColor(rhs);
  TVar2 = getColor(this);
  if (TVar1 == TVar2) {
    TVar3 = getValue(this);
    TVar4 = getValue(rhs);
    this_local._7_1_ = (int)TVar4 < (int)TVar3;
  }
  else {
    TVar1 = getColor(this);
    TVar2 = Contract::getColor(c);
    local_3d = false;
    if (TVar1 == TVar2) {
      TVar1 = getColor(rhs);
      TVar2 = Contract::getColor(c);
      local_3d = TVar1 != TVar2;
    }
    this_local._7_1_ = local_3d;
  }
  return this_local._7_1_;
}

Assistant:

bool Card::isBigger(Card *rhs, Contract *c) {
    if (rhs->getColor() == getColor()) {
        return getValue() > rhs->getValue();
    }
    return getColor() == c->getColor() && rhs->getColor() != c->getColor();
}